

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<double>::ensureHaveBufferIndexCopyProgram
          (ManagedBuffer<double> *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if ((this->renderAttributeBuffer).
      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0 &&
      (this->bufferIndexCopyProgram).
      super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::operator+(&local_28,"ManagedBuffer ",&this->name);
    std::operator+(&bStack_48,&local_28," asked to copy indices, but has no buffers");
    exception(&bStack_48);
    std::__cxx11::string::~string((string *)&bStack_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::ensureHaveBufferIndexCopyProgram() {
  if (bufferIndexCopyProgram) return;

  // sanity check
  if (!renderAttributeBuffer) exception("ManagedBuffer " + name + " asked to copy indices, but has no buffers");

  // TODO allocate the transform feedback program
}